

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.h
# Opt level: O0

void __thiscall hwnet::Poller::~Poller(Poller *this)

{
  ThreadPool *this_00;
  Poller *this_local;
  
  if (((this->poolCreateByNew & 1U) != 0) && (this_00 = this->pool_, this_00 != (ThreadPool *)0x0))
  {
    ThreadPool::~ThreadPool(this_00);
    operator_delete(this_00,0xe0);
  }
  util::TimerRoutine::~TimerRoutine(&this->timerRoutine);
  std::__cxx11::
  list<std::shared_ptr<hwnet::Channel>,_std::allocator<std::shared_ptr<hwnet::Channel>_>_>::~list
            (&this->waitRemove);
  std::shared_ptr<hwnet::Poller::notifyChannel>::~shared_ptr(&this->notifyChannel_);
  Epoll::~Epoll(&this->poller_);
  std::
  unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
  ::~unordered_map(&this->channels);
  return;
}

Assistant:

~Poller() {
		if(this->poolCreateByNew){
			delete this->pool_;
		}
	}